

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testvidinfo.c
# Opt level: O0

int RunBlitTests(SDL_Surface *screen,SDL_Surface *bmp,int blitcount)

{
  int iVar1;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  SDL_Rect dst;
  int maxy;
  int maxx;
  int j;
  int i;
  int blitcount_local;
  SDL_Surface *bmp_local;
  SDL_Surface *screen_local;
  
  dst._4_4_ = (screen->w - bmp->w) + 1;
  dst._0_4_ = (screen->h - bmp->h) + 1;
  for (maxx = 0; maxx < 500; maxx = maxx + 1) {
    for (maxy = 0; maxy < blitcount; maxy = maxy + 1) {
      if (dst._4_4_ == 0) {
        local_34 = 0;
      }
      else {
        iVar1 = rand();
        local_34 = (undefined2)(iVar1 % (int)dst._4_4_);
      }
      if (dst._0_4_ == 0) {
        local_32 = 0;
      }
      else {
        iVar1 = rand();
        local_32 = (undefined2)(iVar1 % (int)dst._0_4_);
      }
      local_30 = (undefined2)bmp->w;
      local_2e = (undefined2)bmp->h;
      SDL_UpperBlit(bmp,0,screen,&local_34);
    }
    SDL_Flip(screen);
  }
  return maxx;
}

Assistant:

int RunBlitTests(SDL_Surface *screen, SDL_Surface *bmp, int blitcount)
{
	int i, j;
	int maxx;
	int maxy;
	SDL_Rect dst;

	maxx = (int)screen->w - bmp->w + 1;
	maxy = (int)screen->h - bmp->h + 1;
	for ( i = 0; i < NUM_UPDATES; ++i ) {
		for ( j = 0; j < blitcount; ++j ) {
			if ( maxx ) {
				dst.x = rand() % maxx;
			} else {
				dst.x = 0;
			}
			if ( maxy ) {
				dst.y = rand() % maxy;
			} else {
				dst.y = 0;
			}
			dst.w = bmp->w;
			dst.h = bmp->h;
			SDL_BlitSurface(bmp, NULL, screen, &dst);
		}
		SDL_Flip(screen);
	}

	return i;
}